

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

void anon_unknown.dwarf_e925f::trimString(string *str)

{
  long lVar1;
  string *in_RDI;
  size_t pos;
  string spaceChars;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::find_first_not_of(in_RDI,(ulong)local_28);
  std::__cxx11::string::erase((ulong)in_RDI,0);
  lVar1 = std::__cxx11::string::find_last_not_of(in_RDI,(ulong)local_28);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)in_RDI,lVar1 + 1);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void trimString(string& str)
{
  string spaceChars = " \f\n\r\t\v";
  size_t pos = str.find_first_not_of(spaceChars);
  str.erase(0, pos);

  pos = str.find_last_not_of(spaceChars);
  if (pos != string::npos)
    str.erase(pos + 1);
}